

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sync(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((((ctx->opcode & 0x600000) == 0x400000) || ((ctx->insns_flags & 0x20) == 0)) &&
     (ctx->pr == false)) {
    uVar1._0_1_ = ctx->lazy_tlb_flush;
    uVar1._1_1_ = ctx->need_access_type;
    uVar1._2_2_ = *(undefined2 *)&ctx->field_0x36;
    gen_check_tlb_flush((DisasContext_conflict10 *)(ulong)uVar1,SUB81(tcg_ctx,0));
  }
  tcg_gen_mb_ppc64(tcg_ctx,TCG_BAR_SC|TCG_MO_ALL);
  return;
}

Assistant:

static void gen_sync(TCGContext *tcg_ctx, int stype)
{
    TCGBar tcg_mo = TCG_BAR_SC;

    switch (stype) {
    case 0x4: /* SYNC_WMB */
        tcg_mo |= TCG_MO_ST_ST;
        break;
    case 0x10: /* SYNC_MB */
        tcg_mo |= TCG_MO_ALL;
        break;
    case 0x11: /* SYNC_ACQUIRE */
        tcg_mo |= TCG_MO_LD_LD | TCG_MO_LD_ST;
        break;
    case 0x12: /* SYNC_RELEASE */
        tcg_mo |= TCG_MO_ST_ST | TCG_MO_LD_ST;
        break;
    case 0x13: /* SYNC_RMB */
        tcg_mo |= TCG_MO_LD_LD;
        break;
    default:
        tcg_mo |= TCG_MO_ALL;
        break;
    }

    tcg_gen_mb(tcg_ctx, tcg_mo);
}